

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

HierarchyCPT * __thiscall
despot::Parser::CreateHierarchyObsFunction(Parser *this,TiXmlElement *e_CondProb)

{
  NamedVar *pNVar1;
  pointer pcVar2;
  double dVar3;
  pointer pdVar4;
  bool bVar5;
  bool condition;
  int iVar6;
  uint uVar7;
  TiXmlElement *pTVar8;
  char *pcVar9;
  long *plVar10;
  TiXmlNode *pTVar11;
  mapped_type *ppVVar12;
  TiXmlElement *pTVar13;
  size_type *psVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  pointer pbVar18;
  string parent_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  vector<double,_std::allocator<double>_> values;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> parents;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parent_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value_tokens;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_250 [32];
  HierarchyCPT *local_230;
  Parser *local_228;
  TiXmlElement *local_220;
  TiXmlElement *local_218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  vector<double,_std::allocator<double>_> local_1f8;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_1d8;
  string local_1c0;
  string local_1a0;
  string local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  string local_148;
  string local_128;
  NamedVar *local_108;
  vector<despot::NamedVar,_std::allocator<despot::NamedVar>_> *local_100;
  string local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_c0;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_a8;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_220 = e_CondProb;
  pTVar8 = util::tinyxml::TiXmlNode::FirstChildElement(&e_CondProb->super_TiXmlNode,"Var");
  pcVar9 = util::tinyxml::TiXmlElement::GetText(pTVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,pcVar9,(allocator<char> *)&local_278);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  local_228 = this;
  bVar5 = Variable::IsVariableName(&local_70,&this->obs_vars_);
  std::operator+(&local_278,"In <ObsFunction>: Variable ",&local_50);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_278);
  psVar14 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_128.field_2._M_allocated_capacity = *psVar14;
    local_128.field_2._8_8_ = plVar10[3];
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  }
  else {
    local_128.field_2._M_allocated_capacity = *psVar14;
    local_128._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_128._M_string_length = plVar10[1];
  *plVar10 = (long)psVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  pTVar11 = util::tinyxml::TiXmlNode::FirstChild(&local_220->super_TiXmlNode,"Var");
  Ensure(local_228,bVar5,&local_128,&pTVar11->super_TiXmlBase);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_218 = (TiXmlElement *)&local_228->variables_;
  ppVVar12 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                           *)local_218,&local_50);
  pNVar1 = (NamedVar *)*ppVVar12;
  local_1d8.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar8 = util::tinyxml::TiXmlNode::FirstChildElement(&local_220->super_TiXmlNode,"Parent");
  pcVar9 = util::tinyxml::TiXmlElement::GetText(pTVar8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,pcVar9,(allocator<char> *)local_250);
  local_250._0_8_ = local_250 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250," ","");
  Tokenize(&local_160,&local_278,(string *)local_250);
  if ((mapped_type)local_250._0_8_ != (mapped_type)(local_250 + 0x10)) {
    operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
  }
  local_108 = pNVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if (local_160.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_160.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_230 = (HierarchyCPT *)&local_228->curr_state_vars_;
    local_100 = &local_228->action_vars_;
    lVar17 = 8;
    uVar15 = 0;
    do {
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      lVar16 = *(long *)((long)local_160.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar17 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_278,lVar16,
                 *(long *)((long)&((local_160.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar17) + lVar16);
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_180,local_278._M_dataplus._M_p,
                 local_278._M_dataplus._M_p + local_278._M_string_length);
      bVar5 = Variable::IsVariableName
                        (&local_180,
                         (vector<despot::StateVar,_std::allocator<despot::StateVar>_> *)local_230);
      condition = true;
      if (!bVar5) {
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a0,local_278._M_dataplus._M_p,
                   local_278._M_dataplus._M_p + local_278._M_string_length);
        condition = Variable::IsVariableName(&local_1a0,local_100);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                     "In <ObsFunction>: Parent ",&local_278);
      plVar10 = (long *)std::__cxx11::string::append((char *)local_250);
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      psVar14 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_1c0.field_2._M_allocated_capacity = *psVar14;
        local_1c0.field_2._8_8_ = plVar10[3];
      }
      else {
        local_1c0.field_2._M_allocated_capacity = *psVar14;
        local_1c0._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_1c0._M_string_length = plVar10[1];
      *plVar10 = (long)psVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      pTVar11 = util::tinyxml::TiXmlNode::FirstChild(&local_220->super_TiXmlNode,"Parent");
      Ensure(local_228,condition,&local_1c0,&pTVar11->super_TiXmlBase);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      if ((mapped_type)local_250._0_8_ != (mapped_type)(local_250 + 0x10)) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
      if ((!bVar5) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2)) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      ppVVar12 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                               *)local_218,&local_278);
      local_250._0_8_ = *ppVVar12;
      std::vector<despot::NamedVar*,std::allocator<despot::NamedVar*>>::
      emplace_back<despot::NamedVar*>
                ((vector<despot::NamedVar*,std::allocator<despot::NamedVar*>> *)&local_1d8,
                 (NamedVar **)local_250);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      uVar15 = uVar15 + 1;
      lVar17 = lVar17 + 0x20;
    } while (uVar15 < (ulong)((long)local_160.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_160.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  local_230 = (HierarchyCPT *)operator_new(0x70);
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector(&local_a8,&local_1d8)
  ;
  HierarchyCPT::HierarchyCPT(local_230,local_108,&local_a8);
  if (local_a8.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pTVar8 = util::tinyxml::TiXmlNode::FirstChildElement(&local_220->super_TiXmlNode,"Dependency");
  pTVar8 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar8->super_TiXmlNode,"Vars");
  if (pTVar8 != (TiXmlElement *)0x0) {
    do {
      pcVar9 = util::tinyxml::TiXmlElement::GetText(pTVar8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,pcVar9,(allocator<char> *)&local_1f8);
      local_250._0_8_ = local_250 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_250," ","");
      Tokenize(&local_210,&local_278,(string *)local_250);
      if ((mapped_type)local_250._0_8_ != (mapped_type)(local_250 + 0x10)) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      pNVar1 = *local_1d8.
                super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      pcVar2 = ((local_210.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_148,pcVar2,
                 pcVar2 + (local_210.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      iVar6 = Variable::IndexOf(&pNVar1->super_Variable,&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      local_278._M_dataplus._M_p = (pointer)0x0;
      local_278._M_string_length = 0;
      local_278.field_2._M_allocated_capacity = 0;
      if (0x20 < (ulong)((long)local_210.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_210.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        uVar15 = 1;
        lVar17 = 0x20;
        do {
          ppVVar12 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                                   *)local_218,
                                  (key_type *)
                                  ((long)&((local_210.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar17));
          local_250._0_8_ = *ppVVar12;
          std::vector<despot::NamedVar*,std::allocator<despot::NamedVar*>>::
          emplace_back<despot::NamedVar*>
                    ((vector<despot::NamedVar*,std::allocator<despot::NamedVar*>> *)&local_278,
                     (NamedVar **)local_250);
          uVar15 = uVar15 + 1;
          lVar17 = lVar17 + 0x20;
        } while (uVar15 < (ulong)((long)local_210.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_210.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
                (&local_c0,
                 (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_278);
      HierarchyCPT::SetParents(local_230,iVar6,&local_c0);
      if (local_c0.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.
                        super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_c0.
                              super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c0.
                              super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pTVar8 = util::tinyxml::TiXmlNode::NextSiblingElement(&pTVar8->super_TiXmlNode);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_278._M_dataplus._M_p,
                        local_278.field_2._M_allocated_capacity - (long)local_278._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_210);
    } while (pTVar8 != (TiXmlElement *)0x0);
  }
  pTVar8 = GetParameterElement(local_228,local_220);
  pTVar8 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar8->super_TiXmlNode,"Entry");
  if (pTVar8 != (TiXmlElement *)0x0) {
    do {
      pTVar13 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar8->super_TiXmlNode,"Instance");
      pcVar9 = util::tinyxml::TiXmlElement::GetText(pTVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,pcVar9,(allocator<char> *)local_250);
      local_250._0_8_ = local_250 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_250," ","");
      Tokenize(&local_210,&local_278,(string *)local_250);
      if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pTVar13 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar8->super_TiXmlNode,"ProbTable");
      pcVar9 = util::tinyxml::TiXmlElement::GetText(pTVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,pcVar9,(allocator<char> *)local_250);
      local_250._0_8_ = local_250 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_250," ","");
      Tokenize(&local_d8,&local_278,(string *)local_250);
      local_218 = pTVar8;
      if ((mapped_type)local_250._0_8_ != (mapped_type)(local_250 + 0x10)) {
        operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
      }
      std::vector<double,_std::allocator<double>_>::resize
                (&local_1f8,
                 (long)local_d8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_d8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      pdVar4 = local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)local_d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        lVar16 = (long)local_d8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_d8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        lVar17 = 0;
        pbVar18 = local_d8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          dVar3 = atof((pbVar18->_M_dataplus)._M_p);
          pdVar4[lVar17] = dVar3;
          lVar17 = lVar17 + 1;
          pbVar18 = pbVar18 + 1;
        } while (lVar16 + (ulong)(lVar16 == 0) != lVar17);
      }
      pNVar1 = *local_1d8.
                super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pcVar2 = ((local_210.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,
                 pcVar2 + (local_210.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      uVar7 = Variable::IndexOf(&pNVar1->super_Variable,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(&local_210,
                 (iterator)
                 local_210.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      iVar6 = (*(local_230->super_CPT).super_Function._vptr_Function[0x12])
                        (local_230,(ulong)uVar7,&local_210,&local_1f8);
      pTVar8 = local_218;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"In <ObsFunction>: Value assignment failed.","");
      pTVar13 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar8->super_TiXmlNode,"Instance");
      Ensure(local_228,SUB41(iVar6,0),&local_f8,(TiXmlBase *)pTVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      pTVar8 = util::tinyxml::TiXmlNode::NextSiblingElement(&pTVar8->super_TiXmlNode);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_210);
    } while (pTVar8 != (TiXmlElement *)0x0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_160);
  if (local_1d8.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.
                    super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.
                          super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return local_230;
}

Assistant:

HierarchyCPT* Parser::CreateHierarchyObsFunction(TiXmlElement* e_CondProb) {
	// <Var>
	string name = GetFirstChildText(e_CondProb, "Var");

	Ensure(Variable::IsVariableName(name, obs_vars_),
		"In <ObsFunction>: Variable " + name
			+ " has not been declared as an ObsVar vname within the <Variable> tag.",
		e_CondProb->FirstChild("Var"));

	ObsVar* child = static_cast<ObsVar*>(variables_[name]);

	// <Parent>
	vector<NamedVar*> parents;
	vector<string> parent_names = Tokenize(
		GetFirstChildText(e_CondProb, "Parent"));
	for (int i = 0; i < parent_names.size(); i++) {
		string parent_name = parent_names[i];
		Ensure(
			Variable::IsVariableName(parent_name, curr_state_vars_)
				|| Variable::IsVariableName(parent_name, action_vars_),
			"In <ObsFunction>: Parent " + parent_name
				+ " has not been declared as a StateVar vnameCurr or an ActionVar vname within the <Variable> tag.",
			e_CondProb->FirstChild("Parent"));

		parents.push_back(static_cast<StateVar*>(variables_[parent_name]));
	}

	HierarchyCPT* func = new HierarchyCPT(child, parents);

	TiXmlElement* e_Dependency = GetFirstChildElement(e_CondProb, "Dependency");
	TiXmlElement* e_Vars = GetFirstChildElement(e_Dependency, "Vars");
	while (e_Vars != NULL) {
		vector<string> tokens = Tokenize(e_Vars->GetText());
		int val = parents[0]->IndexOf(tokens[0]);
		vector<NamedVar*> vars;
		for (int i = 1; i < tokens.size(); i++)
			vars.push_back(static_cast<NamedVar*>(variables_[tokens[i]]));
		func->SetParents(val, vars);

		e_Vars = e_Vars->NextSiblingElement();
	}

	// <Parameter>
	TiXmlElement* e_Parameter = GetParameterElement(e_CondProb);
	TiXmlElement* e_Entry = e_Parameter->FirstChildElement("Entry");
	while (e_Entry != NULL) {
		// <Instance>
		vector<string> instance = Tokenize(
			GetFirstChildText(e_Entry, "Instance"));

		// <ProbTable>
		vector<double> values;
		string table = GetFirstChildText(e_Entry, "ProbTable");

		vector<string> value_tokens = Tokenize(table);

		values.resize(value_tokens.size());
		for (int i = 0; i < value_tokens.size(); i++) {
			values[i] = atof(value_tokens[i].c_str());
		}

		int val = parents[0]->IndexOf(instance[0]);
		instance.erase(instance.begin());
		bool success = func->SetValue(val, instance, values);

		Ensure(success, "In <ObsFunction>: Value assignment failed.",
			GetFirstChildElement(e_Entry, "Instance"));

		e_Entry = e_Entry->NextSiblingElement();
	}

	return func;
}